

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::detectPipeliningSupport(QHttpNetworkConnectionChannel *this)

{
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  bool bVar1;
  int iVar2;
  SocketState SVar3;
  QHttpNetworkReplyPrivate *this_00;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray serverHeaderField;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QIODevice *in_stack_ffffffffffffff30;
  QByteArray *this_01;
  uint5 in_stack_ffffffffffffff40;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  QByteArray *pQVar7;
  QByteArrayView in_stack_ffffffffffffff50;
  undefined1 local_60 [24];
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  pQVar7 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x2faa55);
  iVar2 = (**(code **)(**(long **)((long)(in_RDI + 2) + 8) + 0x70))();
  bVar6 = 0;
  bVar5 = 0;
  bVar4 = 0;
  if (iVar2 == 1) {
    iVar2 = (**(code **)(**(long **)((long)(in_RDI + 2) + 8) + 0x78))();
    bVar4 = 0;
    if (iVar2 == 1) {
      this_00 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2faaad);
      bVar1 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled(this_00);
      bVar4 = 0;
      if (!bVar1) {
        SVar3 = QSocketAbstraction::socketState(in_stack_ffffffffffffff30);
        bVar4 = 0;
        if (SVar3 == ConnectedState) {
          this_01 = *(QByteArray **)((long)(in_RDI + 2) + 8);
          QByteArrayView::QByteArrayView<7ul>
                    ((QByteArrayView *)
                     CONCAT17(bVar6,CONCAT16(bVar5,(uint6)in_stack_ffffffffffffff40)),
                     (char (*) [7])in_RDI);
          QByteArray::QByteArray((QByteArray *)0x2fab11);
          bVar6 = 1;
          (*(code *)(this_01->d).d[9].super_QArrayData.alloc)
                    (local_38,this_01,local_48,local_40,local_60);
          bVar5 = 1;
          QByteArray::operator=
                    (this_01,(QByteArray *)
                             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
          QByteArrayView::QByteArrayView<17ul>
                    ((QByteArrayView *)
                     CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,in_stack_ffffffffffffff40))),
                     (char (*) [17])in_RDI);
          bv.m_size._5_1_ = bVar4;
          bv.m_size._0_5_ = in_stack_ffffffffffffff40;
          bv.m_size._6_1_ = bVar5;
          bv.m_size._7_1_ = bVar6;
          bv.m_data = (storage_type *)pQVar7;
          bVar1 = QByteArray::contains
                            ((QByteArray *)
                             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),bv);
          bVar4 = 0;
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            QByteArrayView::QByteArrayView<17ul>
                      ((QByteArrayView *)
                       CONCAT17(bVar6,CONCAT16(bVar5,(uint6)in_stack_ffffffffffffff40)),
                       (char (*) [17])in_RDI);
            bv_00.m_size._5_1_ = bVar4;
            bv_00.m_size._0_5_ = in_stack_ffffffffffffff40;
            bv_00.m_size._6_1_ = bVar5;
            bv_00.m_size._7_1_ = bVar6;
            bv_00.m_data = (storage_type *)pQVar7;
            bVar1 = QByteArray::contains
                              ((QByteArray *)
                               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),bv_00);
            bVar4 = 0;
            if (!bVar1) {
              QByteArrayView::QByteArrayView<23ul>
                        ((QByteArrayView *)
                         CONCAT17(bVar6,CONCAT16(bVar5,(uint6)in_stack_ffffffffffffff40)),
                         (char (*) [23])in_RDI);
              bv_01.m_size._5_1_ = bVar4;
              bv_01.m_size._0_5_ = in_stack_ffffffffffffff40;
              bv_01.m_size._6_1_ = bVar5;
              bv_01.m_size._7_1_ = bVar6;
              bv_01.m_data = (storage_type *)pQVar7;
              bVar1 = QByteArray::contains
                                ((QByteArray *)
                                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),bv_01
                                );
              bVar4 = 0;
              if (!bVar1) {
                QByteArrayView::QByteArrayView<9ul>
                          ((QByteArrayView *)
                           CONCAT17(bVar6,CONCAT16(bVar5,(uint6)in_stack_ffffffffffffff40)),
                           (char (*) [9])in_RDI);
                bv_02.m_size._5_1_ = bVar4;
                bv_02.m_size._0_5_ = in_stack_ffffffffffffff40;
                bv_02.m_size._6_1_ = bVar5;
                bv_02.m_size._7_1_ = bVar6;
                bv_02.m_data = (storage_type *)pQVar7;
                bVar1 = QByteArray::contains
                                  ((QByteArray *)
                                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                                   bv_02);
                bVar4 = 0;
                if (!bVar1) {
                  QByteArrayView::QByteArrayView<7ul>
                            ((QByteArrayView *)
                             CONCAT17(bVar6,CONCAT16(bVar5,(uint6)in_stack_ffffffffffffff40)),
                             (char (*) [7])in_RDI);
                  bVar1 = QByteArray::startsWith(in_RDI,in_stack_ffffffffffffff50);
                  bVar4 = bVar1 ^ 0xff;
                }
              }
            }
          }
        }
      }
    }
  }
  if ((bVar5 & 1) != 0) {
    QByteArray::~QByteArray((QByteArray *)0x2fac87);
  }
  if ((bVar6 & 1) != 0) {
    QByteArray::~QByteArray((QByteArray *)0x2fac9a);
  }
  if ((bVar4 & 1) == 0) {
    *(char *)&in_RDI[7].d.ptr = '\0';
    *(char *)((long)&in_RDI[7].d.ptr + 1) = '\0';
    *(char *)((long)&in_RDI[7].d.ptr + 2) = '\0';
    *(char *)((long)&in_RDI[7].d.ptr + 3) = '\0';
  }
  else {
    *(char *)&in_RDI[7].d.ptr = '\x01';
    *(char *)((long)&in_RDI[7].d.ptr + 1) = '\0';
    *(char *)((long)&in_RDI[7].d.ptr + 2) = '\0';
    *(char *)((long)&in_RDI[7].d.ptr + 3) = '\0';
  }
  QByteArray::~QByteArray((QByteArray *)0x2facd1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::detectPipeliningSupport()
{
    Q_ASSERT(reply);
    // detect HTTP Pipelining support
    QByteArray serverHeaderField;
    if (
            // check for HTTP/1.1
            (reply->majorVersion() == 1 && reply->minorVersion() == 1)
            // check for not having connection close
            && (!reply->d_func()->isConnectionCloseEnabled())
            // check if it is still connected
            && (QSocketAbstraction::socketState(socket) == QAbstractSocket::ConnectedState)
            // check for broken servers in server reply header
            // this is adapted from http://mxr.mozilla.org/firefox/ident?i=SupportsPipelining
            && (serverHeaderField = reply->headerField("Server"), !serverHeaderField.contains("Microsoft-IIS/4."))
            && (!serverHeaderField.contains("Microsoft-IIS/5."))
            && (!serverHeaderField.contains("Netscape-Enterprise/3."))
            // this is adpoted from the knowledge of the Nokia 7.x browser team (DEF143319)
            && (!serverHeaderField.contains("WebLogic"))
            && (!serverHeaderField.startsWith("Rocket")) // a Python Web Server, see Web2py.com
            ) {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningProbablySupported;
    } else {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;
    }
}